

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O1

int Ivy_ManSeqFindCut_int(Ivy_Man_t *p,Vec_Int_t *vFront,Vec_Int_t *vInside,int nSizeLimit)

{
  int *piVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  int *piVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  int LeavesBest [10];
  uint local_58 [10];
  
  iVar3 = vFront->nSize;
  if ((long)iVar3 < 1) {
    uVar6 = 0xffffffff;
    uVar14 = 99;
  }
  else {
    piVar8 = vFront->pArray;
    uVar14 = 99;
    uVar6 = 0xffffffff;
    lVar7 = 0;
    do {
      uVar5 = piVar8[lVar7];
      if ((int)uVar5 < 1) {
        __assert_fail("Leaf > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                      ,0x35,"int Ivy_NodeGetLeafCostOne(Ivy_Man_t *, int, Vec_Int_t *)");
      }
      if (p->vObjs->nSize <= (int)(uVar5 >> 8)) goto LAB_0090b0fa;
      piVar1 = (int *)p->vObjs->pArray[uVar5 >> 8];
      uVar13 = piVar1[2] & 0xf;
      uVar10 = 999;
      if (((uVar13 != 1) && (*piVar1 != 0)) &&
         (uVar11 = (uint)(uVar13 == 4) + (uVar5 & 0xff), uVar11 < 0x10)) {
        uVar10 = 0;
        uVar4 = 0;
        if (*(ulong *)(piVar1 + 4) != 0) {
          uVar4 = *(int *)(*(ulong *)(piVar1 + 4) & 0xfffffffffffffffe) << 8;
        }
        if ((uVar4 | uVar11) != 0) {
          if ((long)vInside->nSize < 1) {
            uVar10 = 1;
          }
          else {
            lVar16 = 0;
            do {
              if (vInside->pArray[lVar16] == (uVar4 | uVar11)) goto LAB_0090ae61;
              lVar16 = lVar16 + 1;
            } while (vInside->nSize != lVar16);
            uVar10 = 1;
          }
        }
LAB_0090ae61:
        if ((uVar13 != 4) && (uVar13 != 7)) {
          if (uVar13 - 7 < 0xfffffffe) {
            __assert_fail("Ivy_ObjIsNode(pNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                          ,0x45,"int Ivy_NodeGetLeafCostOne(Ivy_Man_t *, int, Vec_Int_t *)");
          }
          iVar12 = 0;
          uVar13 = 0;
          if (*(ulong *)(piVar1 + 6) != 0) {
            uVar13 = *(int *)(*(ulong *)(piVar1 + 6) & 0xfffffffffffffffe) << 8;
          }
          if ((uVar13 | uVar11) != 0) {
            if (0 < (long)vInside->nSize) {
              lVar16 = 0;
              do {
                if (vInside->pArray[lVar16] == (uVar13 | uVar11)) goto LAB_0090aec1;
                lVar16 = lVar16 + 1;
              } while (vInside->nSize != lVar16);
            }
            iVar12 = 1;
          }
LAB_0090aec1:
          uVar10 = uVar10 + iVar12;
        }
      }
      if (uVar10 < uVar14) {
        uVar6 = 1;
        local_58[0] = uVar5;
        uVar14 = uVar10;
      }
      else if (uVar14 == uVar10) {
        lVar16 = (long)(int)uVar6;
        uVar6 = uVar6 + 1;
        local_58[lVar16] = uVar5;
      }
    } while ((1 < uVar14) && (lVar7 = lVar7 + 1, lVar7 != iVar3));
  }
  iVar12 = 0;
  if (uVar14 != 99) {
    if (2 < uVar14) {
      __assert_fail("CostBest < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                    ,0x7d,"int Ivy_ManSeqFindCut_int(Ivy_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
    }
    iVar12 = 0;
    if ((int)(iVar3 + uVar14 + -1) <= nSizeLimit) {
      if ((int)uVar6 < 1) {
        __assert_fail("Counter > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                      ,0x82,"int Ivy_ManSeqFindCut_int(Ivy_Man_t *, Vec_Int_t *, Vec_Int_t *, int)")
        ;
      }
      uVar15 = 0;
      printf("%d",(ulong)uVar6);
      iVar3 = rand();
      uVar14 = local_58[iVar3 % (int)uVar6];
      if ((int)uVar14 < 0) {
        __assert_fail("LeafBest >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                      ,0x88,"int Ivy_ManSeqFindCut_int(Ivy_Man_t *, Vec_Int_t *, Vec_Int_t *, int)")
        ;
      }
      uVar6 = vFront->nSize;
      bVar17 = 0 < (int)uVar6;
      if (0 < (int)uVar6) {
        bVar17 = true;
        if (*vFront->pArray != uVar14) {
          uVar9 = 0;
          do {
            if ((ulong)uVar6 - 1 == uVar9) {
              bVar17 = false;
              uVar15 = (ulong)uVar6;
              goto LAB_0090af94;
            }
            uVar15 = uVar9 + 1;
            lVar7 = uVar9 + 1;
            uVar9 = uVar15;
          } while (vFront->pArray[lVar7] != uVar14);
          bVar17 = uVar15 < uVar6;
        }
      }
LAB_0090af94:
      if ((uint)uVar15 != uVar6) {
        if (!bVar17) {
          __assert_fail("i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
        }
        uVar5 = (uint)uVar15 + 1;
        if ((int)uVar5 < (int)uVar6) {
          piVar1 = vFront->pArray;
          piVar8 = piVar1 + uVar5;
          do {
            iVar3 = (int)uVar15;
            piVar1[uVar15 & 0xffffffff] = *piVar8;
            uVar6 = vFront->nSize;
            piVar8 = piVar8 + 1;
            uVar15 = (ulong)(iVar3 + 1);
          } while (iVar3 + 2 < (int)uVar6);
        }
        vFront->nSize = uVar6 - 1;
      }
      if (p->vObjs->nSize <= (int)(uVar14 >> 8)) {
LAB_0090b0fa:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = p->vObjs->pArray[uVar14 >> 8];
      uVar6 = *(uint *)((long)pvVar2 + 8) & 0xf;
      if ((uVar6 != 7) && (uVar6 - 5 < 2 == (uVar6 == 4))) {
        __assert_fail("Ivy_ObjIsNode(pNode) || Ivy_ObjIsLatch(pNode) || Ivy_ObjIsBuf(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                      ,0x8f,"int Ivy_ManSeqFindCut_int(Ivy_Man_t *, Vec_Int_t *, Vec_Int_t *, int)")
        ;
      }
      uVar14 = (uint)(uVar6 == 4) + (uVar14 & 0xff);
      if (*(ulong *)((long)pvVar2 + 0x10) == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = *(int *)(*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) << 8;
      }
      uVar6 = uVar6 | uVar14;
      if (uVar6 != 0) {
        if (0 < (long)vInside->nSize) {
          lVar7 = 0;
          do {
            if (vInside->pArray[lVar7] == uVar6) goto LAB_0090b06d;
            lVar7 = lVar7 + 1;
          } while (vInside->nSize != lVar7);
        }
        Vec_IntPush(vFront,uVar6);
        Vec_IntPush(vInside,uVar6);
      }
LAB_0090b06d:
      uVar6 = *(uint *)((long)pvVar2 + 8) & 0xf;
      iVar12 = 1;
      if ((uVar6 != 4) && (uVar6 != 7)) {
        if (uVar6 - 7 < 0xfffffffe) {
          __assert_fail("Ivy_ObjIsNode(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                        ,0x9d,
                        "int Ivy_ManSeqFindCut_int(Ivy_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
        }
        if (*(ulong *)((long)pvVar2 + 0x18) == 0) {
          uVar6 = 0;
        }
        else {
          uVar6 = *(int *)(*(ulong *)((long)pvVar2 + 0x18) & 0xfffffffffffffffe) << 8;
        }
        uVar6 = uVar6 | uVar14;
        if (uVar6 != 0) {
          if (0 < (long)vInside->nSize) {
            lVar7 = 0;
            do {
              if (vInside->pArray[lVar7] == uVar6) goto LAB_0090b0da;
              lVar7 = lVar7 + 1;
            } while (vInside->nSize != lVar7);
          }
          Vec_IntPush(vFront,uVar6);
          Vec_IntPush(vInside,uVar6);
        }
LAB_0090b0da:
        if (nSizeLimit < vFront->nSize) {
          __assert_fail("Vec_IntSize(vFront) <= nSizeLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                        ,0xa7,
                        "int Ivy_ManSeqFindCut_int(Ivy_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
        }
      }
    }
  }
  return iVar12;
}

Assistant:

int Ivy_ManSeqFindCut_int( Ivy_Man_t * p, Vec_Int_t * vFront, Vec_Int_t * vInside, int nSizeLimit )
{
    Ivy_Obj_t * pNode;
    int CostBest, CostCur, Leaf, LeafBest, Next, nLatches, i;
    int LeavesBest[10];
    int Counter;

    // add random selection of the best fanin!!!

    // find the best fanin
    CostBest = 99;
    LeafBest = -1;
    Counter = -1;
//printf( "Evaluating fanins of the cut:\n" );
    Vec_IntForEachEntry( vFront, Leaf, i )
    {
        CostCur = Ivy_NodeGetLeafCostOne( p, Leaf, vInside );
//printf( "    Fanin %s has cost %d.\n", Ivy_ObjName(pNode), CostCur );
        if ( CostBest > CostCur )
        {
            CostBest = CostCur;
            LeafBest = Leaf;
            LeavesBest[0] = Leaf;
            Counter = 1;
        }
        else if ( CostBest == CostCur )
            LeavesBest[Counter++] = Leaf;

        if ( CostBest <= 1 ) // can be if ( CostBest <= 1 )
            break;
    }
    if ( CostBest == 99 )
        return 0;
//        return Ivy_NodeBuildCutLevelTwo_int( vInside, vFront, nFaninLimit );

    assert( CostBest < 3 );
    if ( Vec_IntSize(vFront) - 1 + CostBest > nSizeLimit )
        return 0;
//        return Ivy_NodeBuildCutLevelTwo_int( vInside, vFront, nFaninLimit );

    assert( Counter > 0 );
printf( "%d", Counter );

    LeafBest = LeavesBest[rand() % Counter];

    // remove the node from the array
    assert( LeafBest >= 0 );
    Vec_IntRemove( vFront, LeafBest );
//printf( "Removing fanin %s.\n", Ivy_ObjName(pNode) );

    // get the node and its latches
    pNode = Ivy_ManObj( p, Ivy_LeafId(LeafBest) );
    nLatches = Ivy_LeafLat(LeafBest) + Ivy_ObjIsLatch(pNode);
    assert( Ivy_ObjIsNode(pNode) || Ivy_ObjIsLatch(pNode) || Ivy_ObjIsBuf(pNode) );

    // add the left child to the fanins
    Next = Ivy_LeafCreate( Ivy_ObjFaninId0(pNode), nLatches );
    if ( Next && Vec_IntFind(vInside, Next) == -1 )
    {
//printf( "Adding fanin %s.\n", Ivy_ObjName(pNext) );
        Vec_IntPush( vFront, Next );
        Vec_IntPush( vInside, Next );
    }

    // quit if this is the one fanin node
    if ( Ivy_ObjIsLatch(pNode) || Ivy_ObjIsBuf(pNode) )
        return 1;
    assert( Ivy_ObjIsNode(pNode) );

    // add the right child to the fanins
    Next = Ivy_LeafCreate( Ivy_ObjFaninId1(pNode), nLatches );
    if ( Next && Vec_IntFind(vInside, Next) == -1 )
    {
//printf( "Adding fanin %s.\n", Ivy_ObjName(pNext) );
        Vec_IntPush( vFront, Next );
        Vec_IntPush( vInside, Next );
    }
    assert( Vec_IntSize(vFront) <= nSizeLimit );
    // keep doing this
    return 1;
}